

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::Slot
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,uint32 slotId)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_24;
  uint32 uStack_20;
  bool success;
  RegSlot local_1c;
  uint32 slotId_local;
  RegSlot instance_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  uStack_20 = slotId;
  local_1c = instance;
  slotId_local = value;
  instance_local._2_2_ = op;
  _value_local = this;
  CheckOpen(this);
  op_00 = instance_local._2_2_;
  OpLayoutType::OpLayoutType(&local_24,ElementSlot);
  CheckOp(this,op_00,local_24);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(instance_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x624,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  slotId_local = ConsumeReg(this,slotId_local);
  local_1c = ConsumeReg(this,local_1c);
  if ((((instance_local._2_2_ != StObjSlot) && (instance_local._2_2_ != StObjSlotChkUndecl)) &&
      (instance_local._2_2_ != StPropIdArrFromVar)) &&
     (2 < (ushort)(instance_local._2_2_ - LdSlotArr))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x637,"(false)",
                                "The specified OpCode is not intended for slot access");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,instance_local._2_2_,slotId_local,local_1c,uStack_20);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,instance_local._2_2_,slotId_local,local_1c,uStack_20), !bVar2)) &&
     (bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,instance_local._2_2_,slotId_local,local_1c,uStack_20), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x63c,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Slot(OpCode op, RegSlot value, RegSlot instance, uint32 slotId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlot);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);

#if DBG
        switch (op)
        {
#if ENABLE_NATIVE_CODEGEN
        case OpCode::LdSlotArr:
        case OpCode::StSlot:
        case OpCode::StSlotChkUndecl:
#endif
        case OpCode::StObjSlot:
        case OpCode::StObjSlotChkUndecl:
        case OpCode::StPropIdArrFromVar:
            break;

        default:
            AssertMsg(false, "The specified OpCode is not intended for slot access");
            break;
        }
#endif

        MULTISIZE_LAYOUT_WRITE(ElementSlot, op, value, instance, slotId);
    }